

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

QPDF_ERROR_CODE
qpdf_oh_get_page_content_data(qpdf_data qpdf,qpdf_oh page_oh,uchar **bufp,size_t *len)

{
  QPDF_ERROR_CODE QVar1;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(qpdf_oh *)local_48._M_unused._0_8_ = page_oh;
  *(uchar ***)((long)local_48._M_unused._0_8_ + 8) = bufp;
  *(size_t **)((long)local_48._M_unused._0_8_ + 0x10) = len;
  local_30 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1765:30)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1765:30)>
             ::_M_manager;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_oh_get_page_content_data(qpdf_data qpdf, qpdf_oh page_oh, unsigned char** bufp, size_t* len)
{
    return trap_errors(qpdf, [page_oh, bufp, len](qpdf_data q) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_page_content_data");
        auto o = qpdf_oh_item_internal(q, page_oh);
        Pl_Buffer buf("page contents");
        o.pipePageContents(&buf);
        buf.getMallocBuffer(bufp, len);
    });
}